

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_Item::find_shortcut(Fl_Menu_Item *this,int *ip,bool require_alt)

{
  int iVar1;
  int local_34;
  Fl_Menu_Item *pFStack_30;
  int ii;
  Fl_Menu_Item *m;
  bool require_alt_local;
  int *ip_local;
  Fl_Menu_Item *this_local;
  
  if (this != (Fl_Menu_Item *)0x0) {
    local_34 = 0;
    pFStack_30 = this;
    while (pFStack_30->text != (char *)0x0) {
      iVar1 = active(pFStack_30);
      if ((iVar1 != 0) &&
         ((iVar1 = Fl::test_shortcut(pFStack_30->shortcut_), iVar1 != 0 ||
          (iVar1 = Fl_Widget::test_shortcut(pFStack_30->text,require_alt), iVar1 != 0)))) {
        if (ip != (int *)0x0) {
          *ip = local_34;
        }
        return pFStack_30;
      }
      pFStack_30 = next_visible_or_not(pFStack_30);
      local_34 = local_34 + 1;
    }
  }
  return (Fl_Menu_Item *)0x0;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::find_shortcut(int* ip, const bool require_alt) const {
  const Fl_Menu_Item* m = this;
  if (m) for (int ii = 0; m->text; m = next_visible_or_not(m), ii++) {
    if (m->active()) {
      if (Fl::test_shortcut(m->shortcut_)
	 || Fl_Widget::test_shortcut(m->text, require_alt)) {
	if (ip) *ip=ii;
	return m;
      }
    }
  }
  return 0;
}